

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBuilderBeamTaperedTimoshenko::BuildBeam
          (ChBuilderBeamTaperedTimoshenko *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric> *sect,int N,
          shared_ptr<chrono::fea::ChNodeFEAxyzrot> *nodeA,ChVector<double> *B,ChVector<double> Ydir)

{
  double dVar1;
  element_type *peVar2;
  ChMesh *pCVar3;
  element_type *peVar4;
  int iVar5;
  shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric> *this_00;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *pvVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko> element;
  ChElementBase local_238;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_230;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *local_228;
  shared_ptr<chrono::fea::ChMesh> *local_220;
  __shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  *local_218;
  ChBuilderBeamTaperedTimoshenko *local_210;
  ChVector<double> *local_208;
  pointer local_200;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> *local_1f8;
  double local_1f0;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> nodeBi;
  ChQuaternion<double> local_1d8;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_1a8;
  __shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2> local_198 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_188 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  ChVector<double> v_1;
  __shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  local_158;
  ChVector<double> v;
  double *local_130;
  ChMatrix33<double> mrot;
  ChQuaternion<double> local_70;
  ChQuaternion<double> local_50;
  
  local_220 = mesh;
  local_218 = &sect->
               super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>_>_>
  ::clear(&this->beam_elems);
  pvVar6 = &this->beam_nodes;
  local_210 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(pvVar6);
  peVar2 = (nodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  v.m_data._0_16_ =
       vsubpd_avx(*(undefined1 (*) [16])B->m_data,
                  *(undefined1 (*) [16])&(peVar2->super_ChNodeFEAbase).field_0x20);
  v.m_data[2] = B->m_data[2] - *(double *)&peVar2->field_0x30;
  local_208 = B;
  ChMatrix33<double>::Set_A_Xdir(&mrot,&v,(ChVector<double> *)Ydir.m_data[0]);
  local_228 = pvVar6;
  local_1f8 = nodeA;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::push_back(pvVar6,nodeA);
  local_200 = (pointer)(double)N;
  local_1f0 = (double)((ulong)(uint)(~(N >> 0x1f) & N) << 4);
  iVar5 = 1;
  for (dVar7 = 0.0; local_1f0 != dVar7; dVar7 = (double)((long)dVar7 + 0x10)) {
    dVar8 = (double)iVar5 / (double)local_200;
    peVar2 = (local_1f8->
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    dVar1 = *(double *)&peVar2->field_0x30;
    auVar9 = *(undefined1 (*) [16])&(peVar2->super_ChNodeFEAbase).field_0x20;
    auVar10 = vsubpd_avx(*(undefined1 (*) [16])local_208->m_data,auVar9);
    v_1.m_data[2] = dVar1 + dVar8 * (local_208->m_data[2] - dVar1);
    v_1.m_data[0] = auVar9._0_8_ + dVar8 * auVar10._0_8_;
    v_1.m_data[1] = auVar9._8_8_ + dVar8 * auVar10._8_8_;
    ChFrame<double>::ChFrame((ChFrame<double> *)&v,&v_1,&mrot);
    chrono_types::make_shared<chrono::fea::ChNodeFEAxyzrot,_chrono::ChFrame<double>,_0>
              ((chrono_types *)
               &nodeBi.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>,
               (ChFrame<double> *)&v);
    pCVar3 = (local_220->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::fea::ChNodeFEAxyzrot,void>
              (local_188,
               &nodeBi.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)
    ;
    ChMesh::AddNode(pCVar3,(shared_ptr<chrono::fea::ChNodeFEAbase> *)local_188);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_180);
    std::
    vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
    ::push_back(local_228,
                (value_type *)
                &nodeBi.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
               );
    chrono_types::make_shared<chrono::fea::ChElementBeamTaperedTimoshenko,_0>();
    pCVar3 = (local_220->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    std::__shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko,void>
              (local_198,
               &element.
                super___shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko,_(__gnu_cxx::_Lock_policy)2>
              );
    ChMesh::AddElement(pCVar3,(shared_ptr<chrono::fea::ChElementBase> *)local_198);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190);
    std::
    vector<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko>_>_>
    ::push_back(&local_210->beam_elems,&element);
    pvVar6 = local_228;
    peVar4 = element.
             super___shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1a8,
               (__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((local_228->
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr + (long)dVar7));
    std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1b8,
               (__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(pvVar6->
                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[1].
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + (long)dVar7));
    (*(peVar4->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
      [0x1a])(peVar4,&local_1a8,&local_1b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8._M_refcount);
    ChMatrix33<double>::Get_A_quaternion((ChQuaternion<double> *)&v,&mrot);
    peVar4 = element.
             super___shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    auVar9._0_8_ = -(double)local_130;
    auVar9._8_8_ = 0x8000000000000000;
    local_1d8.m_data[1] = -v.m_data[1];
    local_1d8.m_data[2] = -v.m_data[2];
    local_1d8.m_data[0] = v.m_data[0];
    local_1d8.m_data[3] = (double)vmovlpd_avx(auVar9);
    ChElementBeamTaperedTimoshenko::GetNodeA((ChElementBeamTaperedTimoshenko *)&local_238);
    ChQuaternion<double>::operator%
              (&local_50,&local_1d8,(ChQuaternion<double> *)(local_238._vptr_ChElementBase + 7));
    ChQuaternion<double>::operator=(&peVar4->q_refrotA,&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_230);
    peVar4 = element.
             super___shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    auVar10._0_8_ = -(double)local_130;
    auVar10._8_8_ = 0x8000000000000000;
    local_1d8.m_data[1] = -v.m_data[1];
    local_1d8.m_data[2] = -v.m_data[2];
    local_1d8.m_data[0] = v.m_data[0];
    local_1d8.m_data[3] = (double)vmovlpd_avx(auVar10);
    ChElementBeamTaperedTimoshenko::GetNodeB((ChElementBeamTaperedTimoshenko *)&local_238);
    ChQuaternion<double>::operator%
              (&local_70,&local_1d8,(ChQuaternion<double> *)(local_238._vptr_ChElementBase + 7));
    ChQuaternion<double>::operator=(&peVar4->q_refrotB,&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_230);
    this_00 = &(element.
                super___shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->tapered_section;
    std::
    __shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_158,local_218);
    std::
    __shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(&this_00->
                 super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                ,&local_158);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&element.
                super___shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenko,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&nodeBi.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    iVar5 = iVar5 + 1;
  }
  return;
}

Assistant:

void ChBuilderBeamTaperedTimoshenko::BuildBeam(
    std::shared_ptr<ChMesh> mesh,              // mesh to store the resulting elements
    std::shared_ptr<ChBeamSectionTaperedTimoshenkoAdvancedGeneric> sect,  // section material for beam elements
                                   const int N,                               // number of elements in the segment
                                   std::shared_ptr<ChNodeFEAxyzrot> nodeA,    // starting point
                                   const ChVector<> B,                        // ending point
                                   const ChVector<> Ydir                      // the 'up' Y direction of the beam
) {
    beam_elems.clear();
    beam_nodes.clear();

    ChMatrix33<> mrot;
    mrot.Set_A_Xdir(B - nodeA->Frame().GetPos(), Ydir);

    beam_nodes.push_back(nodeA);

    for (int i = 1; i <= N; ++i) {
        double eta = (double)i / (double)N;
        ChVector<> pos = nodeA->Frame().GetPos() + (B - nodeA->Frame().GetPos()) * eta;

        auto nodeBi = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(pos, mrot));
        mesh->AddNode(nodeBi);
        beam_nodes.push_back(nodeBi);

        auto element = chrono_types::make_shared<ChElementBeamTaperedTimoshenko>();
        mesh->AddElement(element);
        beam_elems.push_back(element);

        element->SetNodes(beam_nodes[i - 1], beam_nodes[i]);

        ChQuaternion<> elrot = mrot.Get_A_quaternion();
        element->SetNodeAreferenceRot(elrot.GetConjugate() % element->GetNodeA()->Frame().GetRot());
        element->SetNodeBreferenceRot(elrot.GetConjugate() % element->GetNodeB()->Frame().GetRot());
        // GetLog() << "Element n." << i << " with rotations: \n";
        // GetLog() << "   Qa=" << element->GetNodeAreferenceRot() << "\n";
        // GetLog() << "   Qb=" << element->GetNodeBreferenceRot() << "\n\n";
        element->SetTaperedSection(sect);
    }
}